

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ossadmin_test.cc
# Opt level: O0

int test_create_oss_instance(void)

{
  code *pcVar1;
  char *__s;
  OssAdmincreateOssInstanceRequestType *pOVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_299;
  int ret;
  HttpTestListener *local_278;
  HttpTestListener *listener;
  string local_268;
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [55];
  allocator<char> local_1e1;
  string local_1e0 [32];
  OssAdmincreateOssInstanceRequestType *local_1c0;
  OssAdmin *ossadmin;
  OssAdmincreateOssInstanceResponseType resp;
  OssAdmincreateOssInstanceRequestType req;
  
  aliyun::OssAdmincreateOssInstanceRequestType::OssAdmincreateOssInstanceRequestType
            ((OssAdmincreateOssInstanceRequestType *)((long)&resp.end_time.field_2 + 8));
  aliyun::OssAdmincreateOssInstanceResponseType::OssAdmincreateOssInstanceResponseType
            ((OssAdmincreateOssInstanceResponseType *)&ossadmin);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"cn-hangzhou",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"my_appid",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240,"my_secret",&local_241);
  pOVar2 = (OssAdmincreateOssInstanceRequestType *)
           aliyun::OssAdmin::CreateOssAdminClient(local_1e0,local_218,local_240);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  local_1c0 = pOVar2;
  if (pOVar2 == (OssAdmincreateOssInstanceRequestType *)0x0) {
    aliyun::OssAdmincreateOssInstanceResponseType::~OssAdmincreateOssInstanceResponseType
              ((OssAdmincreateOssInstanceResponseType *)&ossadmin);
    aliyun::OssAdmincreateOssInstanceRequestType::~OssAdmincreateOssInstanceRequestType
              ((OssAdmincreateOssInstanceRequestType *)((long)&resp.end_time.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetProxyHost((OssAdmin *)pOVar2,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::OssAdmin::SetUseTls((OssAdmin *)local_1c0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_create_oss_instance_response;
  local_278 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_299);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_299);
  HttpTestListener::Start(local_278);
  std::__cxx11::string::operator=((string *)(resp.end_time.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"region");
  std::__cxx11::string::operator=((string *)(req.region.field_2._M_local_buf + 8),"aliUid");
  std::__cxx11::string::operator=((string *)(req.ali_uid.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::OssAdmin::createOssInstance
            (local_1c0,(OssAdmincreateOssInstanceResponseType *)((long)&resp.end_time.field_2 + 8),
             (OssAdminErrorInfo *)&ossadmin);
  HttpTestListener::WaitComplete(local_278);
  pHVar3 = local_278;
  if (local_278 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_278);
    operator_delete(pHVar3,0x180);
  }
  pOVar2 = local_1c0;
  if (local_1c0 != (OssAdmincreateOssInstanceRequestType *)0x0) {
    aliyun::OssAdmin::~OssAdmin((OssAdmin *)local_1c0);
    operator_delete(pOVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_create_oss_instance() {
  OssAdmincreateOssInstanceRequestType req;
  OssAdmincreateOssInstanceResponseType resp;
  OssAdmin* ossadmin = OssAdmin::CreateOssAdminClient("cn-hangzhou", "my_appid", "my_secret");
  if(!ossadmin) return 0;
  ossadmin->SetProxyHost("127.0.0.1:12234");
  ossadmin->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_create_oss_instance_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.region = "region";
  req.ali_uid = "aliUid";
  req.owner_account = "OwnerAccount";
  int ret = ossadmin->createOssInstance(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete ossadmin;
}